

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O3

void __thiscall
wasm::BinaryenIRWriter<wasm::StackIRGenerator>::visitTry
          (BinaryenIRWriter<wasm::StackIRGenerator> *this,Try *curr)

{
  size_t sVar1;
  bool bVar2;
  StackInst *in_RAX;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  StackInst *local_38;
  
  local_38 = in_RAX;
  StackIRGenerator::emit((StackIRGenerator *)this,(Expression *)curr);
  visitPossibleBlockContents(this,curr->body);
  if ((curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements == 0
     ) {
    uVar3 = 0;
  }
  else {
    uVar4 = 0;
    uVar5 = 1;
    do {
      local_38 = StackIRGenerator::makeStackInst((StackIRGenerator *)this,Catch,(Expression *)curr);
      std::vector<wasm::StackInst*,std::allocator<wasm::StackInst*>>::emplace_back<wasm::StackInst*>
                ((vector<wasm::StackInst*,std::allocator<wasm::StackInst*>> *)(this + 2),&local_38);
      if ((curr->catchBodies).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          uVar4) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      visitPossibleBlockContents
                (this,(curr->catchBodies).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                      data[uVar4]);
      uVar3 = (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
              usedElements;
      bVar2 = uVar5 < uVar3;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  if ((curr->catchBodies).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
      .usedElements - uVar3 == 1) {
    local_38 = StackIRGenerator::makeStackInst((StackIRGenerator *)this,CatchAll,(Expression *)curr)
    ;
    std::vector<wasm::StackInst*,std::allocator<wasm::StackInst*>>::emplace_back<wasm::StackInst*>
              ((vector<wasm::StackInst*,std::allocator<wasm::StackInst*>> *)(this + 2),&local_38);
    sVar1 = (curr->catchBodies).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (sVar1 == 0) {
      __assert_fail("usedElements > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                    ,0xd0,
                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                   );
    }
    visitPossibleBlockContents
              (this,(curr->catchBodies).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                    [sVar1 - 1]);
  }
  if ((curr->delegateTarget).super_IString.str._M_str == (char *)0x0) {
    StackIRGenerator::emitScopeEnd((StackIRGenerator *)this,(Expression *)curr);
  }
  else {
    local_38 = StackIRGenerator::makeStackInst((StackIRGenerator *)this,Delegate,(Expression *)curr)
    ;
    std::vector<wasm::StackInst*,std::allocator<wasm::StackInst*>>::emplace_back<wasm::StackInst*>
              ((vector<wasm::StackInst*,std::allocator<wasm::StackInst*>> *)(this + 2),&local_38);
  }
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id == 1) {
    StackIRGenerator::emitUnreachable((StackIRGenerator *)this);
  }
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitTry(Try* curr) {
  emit(curr);
  visitPossibleBlockContents(curr->body);
  for (Index i = 0; i < curr->catchTags.size(); i++) {
    emitCatch(curr, i);
    visitPossibleBlockContents(curr->catchBodies[i]);
  }
  if (curr->hasCatchAll()) {
    emitCatchAll(curr);
    visitPossibleBlockContents(curr->catchBodies.back());
  }
  if (curr->isDelegate()) {
    emitDelegate(curr);
    // Note that when we emit a delegate we do not need to also emit a scope
    // ending, as the delegate ends the scope.
  } else {
    emitScopeEnd(curr);
  }
  if (curr->type == Type::unreachable) {
    emitUnreachable();
  }
}